

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void Am_Stop_Widget(Am_Object *widget,Am_Value *final_value)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Value AVar2;
  Am_Object local_50;
  Am_Value v;
  Am_Value local_38;
  Am_Explicit_Widget_Run_Method method;
  
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(widget,0x1e9,1);
  Am_Value::operator=(&v,in_value);
  bVar1 = Am_Value::Valid(&v);
  if (bVar1) {
    Am_Explicit_Widget_Run_Method::Am_Explicit_Widget_Run_Method(&method,&v);
    Am_Object::Am_Object(&local_50,widget);
    Am_Value::Am_Value(&local_38,final_value);
    AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
    AVar2._0_8_ = &local_38;
    (*method.Call)((Am_Object_Data *)&local_50,AVar2);
    Am_Value::~Am_Value(&local_38);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Value::~Am_Value(&v);
  return;
}

Assistant:

void
Am_Stop_Widget(Am_Object widget, Am_Value final_value)
{
  Am_Value v;
  v = widget.Peek(Am_WIDGET_STOP_METHOD);
  if (v.Valid()) {
    Am_Explicit_Widget_Run_Method method = v;
    method.Call(widget, final_value);
  }
}